

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Texture2D * LoadTexture(Texture2D *__return_storage_ptr__,char *fileName)

{
  Image image_00;
  Image image_01;
  Texture2D *pTVar1;
  undefined8 local_3c;
  undefined8 local_34;
  int local_2c;
  undefined1 local_28 [8];
  Image image;
  char *fileName_local;
  
  pTVar1 = __return_storage_ptr__;
  image._16_8_ = fileName;
  memset(__return_storage_ptr__,0,0x14);
  LoadImage((Image *)local_28,(char *)image._16_8_);
  if (local_28 != (undefined1  [8])0x0) {
    image_00.width = image.width;
    image_00.height = image.height;
    image_00.data = image.data;
    image_00._16_8_ = pTVar1;
    LoadTextureFromImage(image_00);
    pTVar1->id = (undefined4)local_3c;
    pTVar1->width = local_3c._4_4_;
    pTVar1->height = (undefined4)local_34;
    pTVar1->mipmaps = local_34._4_4_;
    pTVar1->format = local_2c;
    image_01.width = image.width;
    image_01.height = image.height;
    image_01.data = image.data;
    image_01._16_8_ = pTVar1;
    UnloadImage(image_01);
  }
  return __return_storage_ptr__;
}

Assistant:

Texture2D LoadTexture(const char *fileName)
{
    Texture2D texture = { 0 };

    Image image = LoadImage(fileName);

    if (image.data != NULL)
    {
        texture = LoadTextureFromImage(image);
        UnloadImage(image);
    }

    return texture;
}